

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to4_int8.h
# Opt level: O0

void ncnn::convolution_pack8to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh3;
  __m128i _sl3;
  __m128i _sh2;
  __m128i _sl2;
  __m128i _sh1;
  __m128i _sl1;
  __m128i _sh0;
  __m128i _sl0;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val;
  int k;
  char *sptr;
  Mat m_2;
  int q;
  char *kptr;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffff430;
  size_type in_stack_fffffffffffff438;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff440;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a18;
  undefined8 uStack_a10;
  int local_a04;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined8 local_9e8;
  undefined4 local_9e0;
  long local_9d8;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined8 local_9b8;
  int local_9ac;
  undefined8 local_9a8;
  undefined8 local_9a0;
  undefined8 local_998;
  undefined4 local_990;
  long local_988;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined8 local_968;
  undefined1 (*local_960) [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  int local_918;
  int local_914;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_900;
  undefined4 local_8f8;
  long local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined8 local_8d0;
  long local_8c8;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  reference local_8a8;
  vector<int,_std::allocator<int>_> local_888;
  int local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  long *local_848;
  long *local_840;
  long *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 *local_7f8;
  undefined8 *local_7e8;
  undefined8 *local_7d8;
  undefined1 local_7cd;
  int local_7cc;
  undefined8 *local_7c0;
  undefined1 local_79d;
  int local_79c;
  long *local_798;
  undefined8 *local_790;
  undefined1 local_76d;
  int local_76c;
  undefined8 *local_760;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined1 local_6a8 [16];
  undefined8 local_698;
  undefined8 uStack_690;
  undefined1 local_688 [16];
  undefined8 local_678;
  undefined8 uStack_670;
  undefined1 local_668 [16];
  undefined8 local_658;
  undefined8 uStack_650;
  undefined1 local_648 [16];
  undefined8 local_638;
  undefined8 uStack_630;
  undefined1 local_628 [16];
  undefined8 local_618;
  undefined8 uStack_610;
  undefined1 local_608 [16];
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5e8 [16];
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5c8 [16];
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  long local_5a8;
  undefined4 local_59c;
  long local_598;
  undefined1 (*local_590) [16];
  undefined4 local_584;
  int local_580;
  int local_57c;
  undefined8 *local_578;
  long local_570;
  undefined4 local_564;
  long local_560;
  long local_558;
  undefined4 local_54c;
  int local_548;
  int local_544;
  undefined8 *local_540;
  long local_538;
  undefined4 local_52c;
  long local_528;
  long local_520;
  undefined4 local_514;
  int local_510;
  int local_50c;
  undefined8 *local_508;
  undefined4 local_4fc;
  long local_4f8;
  undefined4 local_4ec;
  long local_4e8;
  undefined4 local_4dc;
  long local_4d8;
  undefined8 *local_4d0;
  undefined1 (*local_4c8) [16];
  undefined1 (*local_4c0) [16];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  ulong uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  ulong uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [16];
  ulong local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  ulong *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_858 = *(int *)((long)in_RDI + 0x2c);
  local_85c = (int)in_RDI[7];
  local_860 = *(int *)((long)in_RSI + 0x2c);
  local_864 = (int)in_RSI[6];
  local_868 = (int)in_RSI[7];
  local_86c = in_ECX * in_R8D;
  local_854 = in_R9D;
  local_850 = in_R8D;
  local_84c = in_ECX;
  local_848 = in_RDX;
  local_840 = in_RSI;
  local_838 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x851fda);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff430);
  std::allocator<int>::~allocator((allocator<int> *)0x852006);
  local_8a8 = std::vector<int,_std::allocator<int>_>::operator[](&local_888,0);
  local_8ac = 0;
  local_8b0 = 0;
  local_8b4 = local_858 * in_stack_00000008 - local_84c * local_854;
  for (local_8b8 = 0; local_8b8 < local_850; local_8b8 = local_8b8 + 1) {
    for (local_8bc = 0; local_8bc < local_84c; local_8bc = local_8bc + 1) {
      local_8a8[local_8ac] = local_8b0;
      local_8ac = local_8ac + 1;
      local_8b0 = local_854 + local_8b0;
    }
    local_8b0 = local_8b4 + local_8b0;
  }
  for (local_8c0 = 0; local_8c0 < local_868; local_8c0 = local_8c0 + 1) {
    local_7c0 = &local_910;
    local_50c = *(int *)((long)local_840 + 0x2c);
    local_510 = (int)local_840[6];
    local_514 = *(undefined4 *)((long)local_840 + 0x34);
    local_520 = *local_840 + local_840[8] * (long)local_8c0 * local_840[2];
    local_528 = local_840[2];
    local_52c = (undefined4)local_840[3];
    local_538 = local_840[4];
    local_508 = &local_910;
    local_4f8 = (long)local_50c * (long)local_510 * local_528;
    local_4a0 = &local_910;
    local_830 = &local_910;
    local_4fc = 0x10;
    local_7cc = local_8c0;
    local_7cd = 1;
    local_910 = 0;
    local_900 = 0;
    local_8f8 = 0;
    local_8e8 = 0;
    local_8e4 = 0;
    local_8e0 = 0;
    local_8dc = 0;
    local_8d8 = 0;
    local_8d0 = 0;
    local_908 = 0;
    local_8c8 = local_520;
    for (local_914 = 0; local_914 < local_864; local_914 = local_914 + 1) {
      for (local_918 = 0; local_918 < local_860; local_918 = local_918 + 1) {
        local_928 = ZEXT816(0);
        local_938 = ZEXT816(0);
        local_948 = ZEXT816(0);
        local_958 = ZEXT816(0);
        local_760 = &local_9a8;
        local_57c = *(int *)((long)local_848 + 0x2c);
        local_580 = (int)local_848[6];
        local_584 = *(undefined4 *)((long)local_848 + 0x34);
        local_590 = (undefined1 (*) [16])
                    (*local_848 + local_848[8] * (long)local_8c0 * local_848[2]);
        local_598 = local_848[2];
        local_59c = (undefined4)local_848[3];
        local_5a8 = local_848[4];
        local_578 = &local_9a8;
        local_4d8 = (long)local_57c * (long)local_580 * local_598;
        local_4d0 = &local_9a8;
        local_828 = &local_9a8;
        uStack_430 = 0;
        local_438 = 0;
        uStack_440 = 0;
        local_448 = 0;
        uStack_450 = 0;
        local_458 = 0;
        uStack_460 = 0;
        local_468 = 0;
        local_4dc = 0x10;
        local_76c = local_8c0;
        local_76d = 1;
        local_9a8 = 0;
        local_998 = 0;
        local_990 = 0;
        local_980 = 0;
        local_97c = 0;
        local_978 = 0;
        local_974 = 0;
        local_970 = 0;
        local_968 = 0;
        local_9a0 = 0;
        local_960 = local_590;
        for (local_9ac = 0; local_9ac < local_85c; local_9ac = local_9ac + 1) {
          local_790 = &local_9f8;
          local_798 = local_838;
          local_79c = local_9ac;
          local_544 = *(int *)((long)local_838 + 0x2c);
          local_548 = (int)local_838[6];
          local_54c = *(undefined4 *)((long)local_838 + 0x34);
          local_558 = *local_838 + local_838[8] * (long)local_9ac * local_838[2];
          local_560 = local_838[2];
          local_564 = (undefined4)local_838[3];
          local_570 = local_838[4];
          local_540 = &local_9f8;
          local_4e8 = (long)local_544 * (long)local_548 * local_560;
          local_4ec = 0x10;
          local_79d = 1;
          local_c = local_914 * in_stack_00000018;
          local_8 = &local_9f8;
          for (local_a04 = 0; local_a04 < local_86c; local_a04 = local_a04 + 1) {
            local_18 = (ulong *)(local_558 + (long)local_544 * (long)local_c * local_560 +
                                 (long)(local_918 * in_stack_00000010 * 8) +
                                (long)(local_8a8[local_a04] << 3));
            local_3e8 = *local_18;
            uStack_20 = 0;
            uStack_370 = 0;
            local_498 = ZEXT816(0) << 0x20;
            local_3d8 = 0;
            local_478._8_8_ = SUB168(ZEXT816(0),4);
            uStack_3d0 = local_478._8_8_;
            uStack_3e0 = 0;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_478._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_3e8;
            local_388 = vpcmpgtb_avx(auVar10 << 0x40,auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_3e8;
            auVar10 = vpunpcklbw_avx(auVar2,local_388);
            local_4c0 = local_960;
            local_408 = *(undefined8 *)*local_960;
            uStack_400 = *(undefined8 *)(*local_960 + 8);
            local_4c8 = local_960 + 1;
            local_428 = *(undefined8 *)*local_4c8;
            uStack_420 = *(undefined8 *)(local_960[1] + 8);
            local_3f8 = 0;
            uStack_3f0 = local_478._8_8_;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_478._8_8_;
            auVar1 = vpcmpgtb_avx(auVar11 << 0x40,*local_960);
            local_418 = 0;
            uStack_410 = local_478._8_8_;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_478._8_8_;
            auVar2 = vpcmpgtb_avx(auVar3 << 0x40,*local_4c8);
            local_a48 = auVar1._0_8_;
            local_3a8 = local_a48;
            uStack_a40 = auVar1._8_8_;
            uStack_3a0 = uStack_a40;
            auVar11 = vpunpcklbw_avx(*local_960,auVar1);
            local_348 = local_a48;
            uStack_340 = uStack_a40;
            auVar1 = vpunpckhbw_avx(*local_960,auVar1);
            local_a58 = auVar2._0_8_;
            local_3c8 = local_a58;
            uStack_a50 = auVar2._8_8_;
            uStack_3c0 = uStack_a50;
            auVar12 = vpunpcklbw_avx(*local_4c8,auVar2);
            local_368 = local_a58;
            uStack_360 = uStack_a50;
            auVar2 = vpunpckhbw_avx(*local_4c8,auVar2);
            local_a18 = auVar10._0_8_;
            local_2b8 = local_a18;
            uStack_a10 = auVar10._8_8_;
            uStack_2b0 = uStack_a10;
            local_a68 = auVar11._0_8_;
            local_2c8 = local_a68;
            uStack_a60 = auVar11._8_8_;
            uStack_2c0 = uStack_a60;
            auVar6 = vpmullw_avx(auVar10,auVar11);
            local_238 = local_a18;
            uStack_230 = uStack_a10;
            local_248 = local_a68;
            uStack_240 = uStack_a60;
            auVar3 = vpmulhw_avx(auVar10,auVar11);
            local_2d8 = local_a18;
            uStack_2d0 = uStack_a10;
            local_a78 = auVar1._0_8_;
            local_2e8 = local_a78;
            uStack_a70 = auVar1._8_8_;
            uStack_2e0 = uStack_a70;
            auVar7 = vpmullw_avx(auVar10,auVar1);
            local_258 = local_a18;
            uStack_250 = uStack_a10;
            local_268 = local_a78;
            uStack_260 = uStack_a70;
            auVar4 = vpmulhw_avx(auVar10,auVar1);
            local_2f8 = local_a18;
            uStack_2f0 = uStack_a10;
            local_a88 = auVar12._0_8_;
            local_308 = local_a88;
            uStack_a80 = auVar12._8_8_;
            uStack_300 = uStack_a80;
            auVar8 = vpmullw_avx(auVar10,auVar12);
            local_278 = local_a18;
            uStack_270 = uStack_a10;
            local_288 = local_a88;
            uStack_280 = uStack_a80;
            auVar12 = vpmulhw_avx(auVar10,auVar12);
            local_318 = local_a18;
            uStack_310 = uStack_a10;
            local_a98 = auVar2._0_8_;
            local_328 = local_a98;
            uStack_a90 = auVar2._8_8_;
            uStack_320 = uStack_a90;
            auVar9 = vpmullw_avx(auVar10,auVar2);
            local_298 = local_a18;
            uStack_290 = uStack_a10;
            local_2a8 = local_a98;
            uStack_2a0 = uStack_a90;
            auVar5 = vpmulhw_avx(auVar10,auVar2);
            local_5b8 = local_928._0_8_;
            uStack_5b0 = local_928._8_8_;
            local_aa8 = auVar6._0_8_;
            local_1b8 = local_aa8;
            uStack_aa0 = auVar6._8_8_;
            uStack_1b0 = uStack_aa0;
            local_ab8 = auVar3._0_8_;
            local_1c8 = local_ab8;
            uStack_ab0 = auVar3._8_8_;
            uStack_1c0 = uStack_ab0;
            local_5c8 = vpunpcklwd_avx(auVar6,auVar3);
            auVar1 = vpaddd_avx(local_928,local_5c8);
            local_5d8 = local_938._0_8_;
            uStack_5d0 = local_938._8_8_;
            local_ac8 = auVar7._0_8_;
            local_1d8 = local_ac8;
            uStack_ac0 = auVar7._8_8_;
            uStack_1d0 = uStack_ac0;
            local_ad8 = auVar4._0_8_;
            local_1e8 = local_ad8;
            uStack_ad0 = auVar4._8_8_;
            uStack_1e0 = uStack_ad0;
            local_5e8 = vpunpcklwd_avx(auVar7,auVar4);
            auVar2 = vpaddd_avx(local_938,local_5e8);
            local_5f8 = local_948._0_8_;
            uStack_5f0 = local_948._8_8_;
            local_ae8 = auVar8._0_8_;
            local_1f8 = local_ae8;
            uStack_ae0 = auVar8._8_8_;
            uStack_1f0 = uStack_ae0;
            local_af8 = auVar12._0_8_;
            local_208 = local_af8;
            uStack_af0 = auVar12._8_8_;
            uStack_200 = uStack_af0;
            local_608 = vpunpcklwd_avx(auVar8,auVar12);
            auVar10 = vpaddd_avx(local_948,local_608);
            local_618 = local_958._0_8_;
            uStack_610 = local_958._8_8_;
            local_b08 = auVar9._0_8_;
            local_218 = local_b08;
            uStack_b00 = auVar9._8_8_;
            uStack_210 = uStack_b00;
            local_b18 = auVar5._0_8_;
            local_228 = local_b18;
            uStack_b10 = auVar5._8_8_;
            uStack_220 = uStack_b10;
            local_628 = vpunpcklwd_avx(auVar9,auVar5);
            auVar11 = vpaddd_avx(local_958,local_628);
            local_928._0_8_ = auVar1._0_8_;
            local_638 = local_928._0_8_;
            local_928._8_8_ = auVar1._8_8_;
            uStack_630 = local_928._8_8_;
            local_138 = local_aa8;
            uStack_130 = uStack_aa0;
            local_148 = local_ab8;
            uStack_140 = uStack_ab0;
            local_648 = vpunpckhwd_avx(auVar6,auVar3);
            local_928 = vpaddd_avx(auVar1,local_648);
            local_938._0_8_ = auVar2._0_8_;
            local_658 = local_938._0_8_;
            local_938._8_8_ = auVar2._8_8_;
            uStack_650 = local_938._8_8_;
            local_158 = local_ac8;
            uStack_150 = uStack_ac0;
            local_168 = local_ad8;
            uStack_160 = uStack_ad0;
            local_668 = vpunpckhwd_avx(auVar7,auVar4);
            local_938 = vpaddd_avx(auVar2,local_668);
            local_948._0_8_ = auVar10._0_8_;
            local_678 = local_948._0_8_;
            local_948._8_8_ = auVar10._8_8_;
            uStack_670 = local_948._8_8_;
            local_178 = local_ae8;
            uStack_170 = uStack_ae0;
            local_188 = local_af8;
            uStack_180 = uStack_af0;
            local_688 = vpunpckhwd_avx(auVar8,auVar12);
            local_948 = vpaddd_avx(auVar10,local_688);
            local_958._0_8_ = auVar11._0_8_;
            local_698 = local_958._0_8_;
            local_958._8_8_ = auVar11._8_8_;
            uStack_690 = local_958._8_8_;
            local_198 = local_b08;
            uStack_190 = uStack_b00;
            local_1a8 = local_b18;
            uStack_1a0 = uStack_b10;
            local_6a8 = vpunpckhwd_avx(auVar9,auVar5);
            local_958 = vpaddd_avx(auVar11,local_6a8);
            local_960 = local_960 + 2;
            local_488 = local_498;
            local_478 = local_498;
            local_3b8 = local_428;
            uStack_3b0 = uStack_420;
            local_398 = local_408;
            uStack_390 = uStack_400;
            local_378 = local_3e8;
            local_358 = local_428;
            uStack_350 = uStack_420;
            local_338 = local_408;
            uStack_330 = uStack_400;
            local_28 = local_3e8;
          }
          local_820 = &local_9f8;
          local_9f8 = 0;
          local_9e8 = 0;
          local_9e0 = 0;
          local_9d0 = 0;
          local_9cc = 0;
          local_9c8 = 0;
          local_9c4 = 0;
          local_9c0 = 0;
          local_9b8 = 0;
          local_9f0 = 0;
          local_7f8 = local_820;
          local_9d8 = local_570;
        }
        local_f8 = local_928._0_8_;
        uStack_f0 = local_928._8_8_;
        local_108 = local_938._0_8_;
        uStack_100 = local_938._8_8_;
        auVar10 = vpunpckldq_avx(local_928,local_938);
        local_118 = local_948._0_8_;
        uStack_110 = local_948._8_8_;
        local_128 = local_958._0_8_;
        uStack_120 = local_958._8_8_;
        auVar11 = vpunpckldq_avx(local_948,local_958);
        local_b8 = local_928._0_8_;
        uStack_b0 = local_928._8_8_;
        local_c8 = local_938._0_8_;
        uStack_c0 = local_938._8_8_;
        auVar1 = vpunpckhdq_avx(local_928,local_938);
        local_d8 = local_948._0_8_;
        uStack_d0 = local_948._8_8_;
        local_e8 = local_958._0_8_;
        uStack_e0 = local_958._8_8_;
        auVar2 = vpunpckhdq_avx(local_948,local_958);
        local_b28 = auVar10._0_8_;
        local_78 = local_b28;
        uStack_b20 = auVar10._8_8_;
        uStack_70 = uStack_b20;
        local_b38 = auVar11._0_8_;
        local_88 = local_b38;
        uStack_b30 = auVar11._8_8_;
        uStack_80 = uStack_b30;
        auVar3 = vpunpcklqdq_avx(auVar10,auVar11);
        local_38 = local_b28;
        uStack_30 = uStack_b20;
        local_48 = local_b38;
        uStack_40 = uStack_b30;
        local_938 = vpunpckhqdq_avx(auVar10,auVar11);
        local_b48 = auVar1._0_8_;
        local_98 = local_b48;
        uStack_b40 = auVar1._8_8_;
        uStack_90 = uStack_b40;
        local_b58 = auVar2._0_8_;
        local_a8 = local_b58;
        uStack_b50 = auVar2._8_8_;
        uStack_a0 = uStack_b50;
        auVar10 = vpunpcklqdq_avx(auVar1,auVar2);
        local_58 = local_b48;
        uStack_50 = uStack_b40;
        local_68 = local_b58;
        uStack_60 = uStack_b50;
        local_958 = vpunpckhqdq_avx(auVar1,auVar2);
        local_928._0_8_ = auVar3._0_8_;
        local_6b8 = local_928._0_8_;
        local_928._8_8_ = auVar3._8_8_;
        uStack_6b0 = local_928._8_8_;
        local_6c8 = local_938._0_8_;
        uStack_6c0 = local_938._8_8_;
        auVar1 = vpaddd_avx(auVar3,local_938);
        local_948._0_8_ = auVar10._0_8_;
        local_6d8 = local_948._0_8_;
        local_948._8_8_ = auVar10._8_8_;
        uStack_6d0 = local_948._8_8_;
        local_6e8 = local_958._0_8_;
        uStack_6e0 = local_958._8_8_;
        local_948 = vpaddd_avx(auVar10,local_958);
        local_928._0_8_ = auVar1._0_8_;
        local_6f8 = local_928._0_8_;
        local_928._8_8_ = auVar1._8_8_;
        uStack_6f0 = local_928._8_8_;
        local_708 = local_948._0_8_;
        uStack_700 = local_948._8_8_;
        local_928 = vpaddd_avx(auVar1,local_948);
        local_4a8 = (undefined8 *)(local_8c8 + (long)(local_918 << 2) * 4);
        local_4b8 = local_928._0_8_;
        uStack_4b0 = local_928._8_8_;
        *local_4a8 = local_928._0_8_;
        local_4a8[1] = local_928._8_8_;
        local_7e8 = local_828;
        local_988 = local_5a8;
      }
      local_8c8 = local_8c8 + (long)(local_860 << 2) * 4;
    }
    local_7d8 = local_830;
    local_8f0 = local_538;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff430);
  return;
}

Assistant:

static void convolution_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                        _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr);
                        __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr + 16));
                        __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                        __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                        __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                        __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                        __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                        __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                        __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                        __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                        __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                        __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                        __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                        __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                        __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                        __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                        _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                        _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                        _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                        _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                        _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                        _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                        _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                        _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                        kptr += 32;
                    }
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);

                _sum0 = _mm_add_epi32(_sum0, _sum2);

                _mm_storeu_si128((__m128i*)(outptr + j * 4), _sum0);
            }

            outptr += outw * 4;
        }
    }
}